

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

int Ivy_ManHaigCountChoices(Ivy_Man_t *p,int *pnChoices)

{
  Ivy_Man_t *pIVar1;
  void *pvVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  char *__assertion;
  int iVar6;
  int i;
  
  pIVar1 = p->pHaig;
  if (pIVar1 == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                  ,0x141,"int Ivy_ManHaigCountChoices(Ivy_Man_t *, int *)");
  }
  iVar5 = 0;
  iVar6 = 0;
  i = 0;
  do {
    if (pIVar1->vObjs->nSize <= i) {
      *pnChoices = iVar6;
      return iVar5;
    }
    pvVar2 = Vec_PtrEntry(pIVar1->vObjs,i);
    if ((((pvVar2 != (void *)0x0) && (i != 0)) && (2 < (*(uint *)((long)pvVar2 + 8) & 0xf) - 1)) &&
       (*(int *)((long)pvVar2 + 0xc) != 0)) {
      if (((ulong)pvVar2 & 1) != 0) {
        __assertion = "!Ivy_IsComplement(pObj)";
        uVar3 = 0x44;
LAB_006486b1:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                      ,uVar3,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
      }
      if (*(int *)((long)pvVar2 + 0xc) < 1) {
        __assertion = "Ivy_ObjRefs(pObj) > 0";
        uVar3 = 0x45;
        goto LAB_006486b1;
      }
      pvVar4 = *(void **)((long)pvVar2 + 0x48);
      uVar3 = 1;
      if (pvVar4 != (void *)0x0) {
        if (((ulong)pvVar4 & 1) != 0) {
          __assertion = "!Ivy_IsComplement(pObj->pEquiv)";
          uVar3 = 0x48;
          goto LAB_006486b1;
        }
        uVar3 = 1;
        for (; pvVar4 != pvVar2;
            pvVar4 = (void *)(*(ulong *)((long)pvVar4 + 0x48) & 0xfffffffffffffffe)) {
          uVar3 = uVar3 + 1;
        }
      }
      iVar5 = (iVar5 + 1) - (uint)(uVar3 < 2);
      iVar6 = iVar6 + uVar3 + -1;
    }
    i = i + 1;
    pIVar1 = p->pHaig;
  } while( true );
}

Assistant:

int Ivy_ManHaigCountChoices( Ivy_Man_t * p, int * pnChoices )
{
    Ivy_Obj_t * pObj;
    int nChoices, nChoiceNodes, Counter, i;
    assert( p->pHaig != NULL );
    nChoices = nChoiceNodes = 0;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjIsTerm(pObj) || i == 0 )
            continue;
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        Counter = Ivy_HaigObjCountClass( pObj );
        nChoiceNodes += (int)(Counter > 1);
        nChoices += Counter - 1;
//        if ( Counter > 1 )
//            printf( "Choice node %d %s\n", pObj->Id, Ivy_ObjIsLatch(pObj)? "(latch)": "" );
    }
    *pnChoices = nChoices;
    return nChoiceNodes;
}